

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O0

void P_ResetSightCounters(bool full)

{
  double dVar1;
  double dVar2;
  bool full_local;
  
  if (full) {
    cycle_t::Reset(&MaxSightCycles);
  }
  dVar1 = cycle_t::Time(&SightCycles);
  dVar2 = cycle_t::Time(&MaxSightCycles);
  if (dVar2 < dVar1) {
    cycle_t::operator=(&MaxSightCycles,&SightCycles);
  }
  cycle_t::Reset(&SightCycles);
  memset(sightcounts,0,0x18);
  return;
}

Assistant:

void P_ResetSightCounters (bool full)
{
	if (full)
	{
		MaxSightCycles.Reset();
	}
	if (SightCycles.Time() > MaxSightCycles.Time())
	{
		MaxSightCycles = SightCycles;
	}
	SightCycles.Reset();
	memset (sightcounts, 0, sizeof(sightcounts));
}